

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

QHttp2Connection *
QHttp2Connection::createDirectServerConnection(QIODevice *socket,QHttp2Configuration *config)

{
  QHttp2Connection *this;
  long in_FS_OFFSET;
  QHttp2Configuration QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QHttp2Connection *)operator_new(0x2b8);
  QHttp2Connection((QHttp2Connection *)this,socket);
  QHttp2Configuration::QHttp2Configuration(&QStack_28,config);
  setH2Configuration((QHttp2Connection *)this,(QHttp2Configuration)&QStack_28);
  QHttp2Configuration::~QHttp2Configuration(&QStack_28);
  this->m_connectionType = Server;
  this->m_nextStreamID = 2;
  this->m_waitingForClientPreface = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Connection *QHttp2Connection::createDirectServerConnection(QIODevice *socket,
                                                                 const QHttp2Configuration &config)
{
    auto connection = std::unique_ptr<QHttp2Connection>(new QHttp2Connection(socket));
    connection->setH2Configuration(config);
    connection->m_connectionType = QHttp2Connection::Type::Server;

    connection->m_nextStreamID = 2; // server-initiated streams must be even

    connection->m_waitingForClientPreface = true;

    return connection.release();
}